

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O0

ssize_t __thiscall
libnbt::NBTTagVector<libnbt::NBTBase_*>::read
          (NBTTagVector<libnbt::NBTBase_*> *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  value_type local_28;
  NBTBase *temp;
  int i;
  int32_t size;
  istream *in_local;
  NBTTagVector<libnbt::NBTBase_*> *this_local;
  
  _i = (istream *)CONCAT44(in_register_00000034,__fd);
  temp._4_4_ = 0;
  in_local = (istream *)this;
  readBytes(_i,(char *)((long)&temp + 4),'\x04');
  (*(this->super_NBTBase)._vptr_NBTBase[8])();
  for (temp._0_4_ = 0; (int)(uint)temp < temp._4_4_; temp._0_4_ = (uint)temp + 1) {
    readBytes(_i,(char *)&local_28,NBTTagVector<libnbt::NBTBase*>::width);
    std::vector<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>::push_back
              (&this->array,&local_28);
  }
  return (ulong)(uint)temp;
}

Assistant:

void NBTTagVector<T>::read(std::istream &in) {
        int32_t size = 0;
        readBytes(in, (char *) &size, 4);
        clear();
        for (int i = 0; i < size; i++) {
            T temp;
            readBytes(in, (char *) &temp, width);
            array.push_back(temp);
        }
    }